

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_115e484::MachineRunner::stop(MachineRunner *this)

{
  State SVar1;
  MachineRunner *this_local;
  memory_order __b;
  
  if (this->timer_ != 0) {
    std::atomic<(anonymous_namespace)::MachineRunner::State>::operator=(&this->state_,Stopping);
    while (SVar1 = std::atomic::operator_cast_to_State((atomic *)&this->state_), SVar1 == Stopping)
    {
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      LOCK();
      (this->frame_lock_).super___atomic_flag_base._M_i = false;
      UNLOCK();
    }
    SDL_RemoveTimer(this->timer_);
    this->timer_ = 0;
  }
  return;
}

Assistant:

void stop() {
		if(timer_) {
			// SDL doesn't define whether SDL_RemoveTimer will block until any pending calls
			// have been completed, or will return instantly. So: do an ordered shutdown,
			// then remove the timer.
			state_ = State::Stopping;
			while(state_ == State::Stopping) {
				frame_lock_.clear();
			}

			SDL_RemoveTimer(timer_);
			timer_ = 0;
		}
	}